

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::checkTimeStep(PeleLM *this,Real a_time,Real a_dt)

{
  bool bVar1;
  MFIter *mfi_00;
  FabArray<amrex::FArrayBox> *in_RDI;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  GpuArray<double,_3U> dxinv;
  Real rho_min;
  Real divu_dt_fac;
  int divu_check_flag;
  Array4<const_double> *areaz;
  Array4<const_double> *areay;
  Array4<const_double> *areax;
  Array4<const_double> *vol;
  Array4<const_double> *divu;
  Array4<const_double> *vel;
  Array4<const_double> *rho;
  Box *bx;
  MFIter mfi;
  MultiFab *S;
  MultiFab *divU;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb3c;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  FabArrayBase *in_stack_fffffffffffffb48;
  MFIter *in_stack_fffffffffffffb50;
  anon_class_504_12_60b3b078 *in_stack_fffffffffffffb68;
  Box *in_stack_fffffffffffffb70;
  MFIter *in_stack_fffffffffffffb80;
  undefined1 auStack_450 [64];
  undefined1 auStack_410 [64];
  undefined1 auStack_3d0 [64];
  undefined1 auStack_390 [64];
  undefined1 auStack_350 [64];
  int local_310;
  Real local_308;
  Real local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  undefined8 local_2e0;
  GpuArray<double,_3U> local_2d8;
  Real local_2c0;
  Real local_2b8;
  int local_2ac;
  undefined1 local_2a8 [64];
  undefined1 *local_268;
  undefined1 local_260 [64];
  undefined1 *local_220;
  undefined1 local_218 [64];
  undefined1 *local_1d8;
  undefined1 local_1d0 [64];
  undefined1 *local_190;
  undefined1 local_188 [64];
  undefined1 *local_148;
  undefined1 local_140 [64];
  undefined1 *local_100;
  undefined1 local_f8 [64];
  undefined1 *local_b8;
  undefined1 local_ac [28];
  undefined1 *local_90;
  MFIter local_88;
  MFIter *local_28;
  MultiFab *local_20;
  undefined8 local_18;
  
  local_18 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if ((NavierStokesBase::fixed_dt <= 0.0) && (divu_ceiling != 0)) {
    local_20 = amrex::AmrLevel::get_data
                         ((AmrLevel *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                          in_stack_fffffffffffffb3c,(Real)in_stack_fffffffffffffb30);
    mfi_00 = (MFIter *)
             amrex::AmrLevel::get_data
                       ((AmrLevel *)CONCAT17(in_stack_fffffffffffffb47,in_stack_fffffffffffffb40),
                        in_stack_fffffffffffffb3c,(Real)in_stack_fffffffffffffb30);
    local_28 = mfi_00;
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,(bool)in_stack_fffffffffffffb47);
    while (bVar1 = amrex::MFIter::isValid(&local_88), bVar1) {
      amrex::MFIter::tilebox(in_stack_fffffffffffffb80);
      local_90 = local_ac;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(in_RDI,mfi_00);
      local_b8 = local_f8;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffffb30,(MFIter *)in_RDI,(int)((ulong)mfi_00 >> 0x20));
      local_100 = local_140;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(in_RDI,mfi_00);
      local_148 = local_188;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(in_RDI,mfi_00);
      local_190 = local_1d0;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(in_RDI,mfi_00);
      local_1d8 = local_218;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(in_RDI,mfi_00);
      local_220 = local_260;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(in_RDI,mfi_00);
      local_268 = local_2a8;
      local_2ac = divu_ceiling;
      local_2b8 = divu_dt_factor;
      local_2c0 = min_rho_divu_ceiling;
      amrex::CoordSys::InvCellSizeArray
                (&local_2d8,
                 (CoordSys *)&(in_RDI->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_typ);
      memcpy(&stack0xfffffffffffffb30,local_b8,0x3c);
      memcpy(&stack0xfffffffffffffb70,local_100,0x3c);
      memcpy(auStack_450,local_148,0x3c);
      memcpy(auStack_410,local_190,0x3c);
      memcpy(auStack_3d0,local_1d8,0x3c);
      memcpy(auStack_390,local_220,0x3c);
      memcpy(auStack_350,local_268,0x3c);
      local_310 = local_2ac;
      local_308 = local_2b8;
      local_300 = local_2c0;
      local_2f8 = local_2d8.arr[0];
      local_2f0 = local_2d8.arr[1];
      local_2e8 = local_2d8.arr[2];
      local_2e0 = local_18;
      amrex::ParallelFor<PeleLM::checkTimeStep(double,double)::__0>
                (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
      amrex::MFIter::operator++(&local_88);
    }
    amrex::MFIter::~MFIter(mfi_00);
  }
  return;
}

Assistant:

void
PeleLM::checkTimeStep (const Real a_time,
                       Real a_dt)
{
   BL_PROFILE("PLM::checkTimeStep()");

   if (fixed_dt > 0.0 || !divu_ceiling) {
      return;
   }

   // Get class state data refs. We assume it's been FillPatched already !
   const MultiFab& divU = get_data(Divu_Type,a_time);
   const MultiFab& S    = get_data(State_Type,a_time);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid();++mfi)
   {
      const Box&  bx   = mfi.tilebox();
      auto const& rho  = rho_ctime.const_array(mfi);
      auto const& vel  = S.const_array(mfi,0);
      auto const& divu = divU.const_array(mfi);
      auto const& vol  = volume.const_array(mfi);
      AMREX_D_TERM(auto const& areax = (area[0]).const_array(mfi);,
                   auto const& areay = (area[1]).const_array(mfi);,
                   auto const& areaz = (area[2]).const_array(mfi););
      int  divu_check_flag = divu_ceiling;
      Real divu_dt_fac     = divu_dt_factor;
      Real rho_min         = min_rho_divu_ceiling;
      const auto dxinv     = geom.InvCellSizeArray();

      amrex::ParallelFor(bx, [rho, vel, divu, vol, AMREX_D_DECL(areax,areay,areaz),
                              divu_check_flag, divu_dt_fac, rho_min, dxinv, a_dt]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         check_divu_dt(i, j, k, divu_check_flag, divu_dt_fac, rho_min, dxinv,
                       rho, vel, divu, vol, AMREX_D_DECL(areax,areay,areaz), a_dt);
      });
   }
}